

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2918d1::ArgParser::argJobJsonHelp(ArgParser *this)

{
  element_type *peVar1;
  element_type *this_00;
  Pipeline *this_01;
  int version;
  string local_60;
  shared_ptr<QPDFLogger> local_30;
  QPDFLogger local_20;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  QPDFLogger::defaultLogger();
  peVar1 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_30);
  QPDFLogger::getInfo(&local_20,SUB81(peVar1,0));
  this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_20);
  QPDFJob::job_json_schema_abi_cxx11_(&local_60,(QPDFJob *)0x1,version);
  this_01 = Pipeline::operator<<(this_00,&local_60);
  Pipeline::operator<<(this_01,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_20);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_30);
  return;
}

Assistant:

void
ArgParser::argJobJsonHelp()
{
    *QPDFLogger::defaultLogger()->getInfo()
        << QPDFJob::job_json_schema(QPDFJob::LATEST_JOB_JSON) << "\n";
}